

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::AddDefaultExtraGenerators(cmake *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mapped_type *pp_Var2;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40.field_2._M_allocated_capacity._0_4_ = 0x65646f43;
  local_40.field_2._M_local_buf[4] = 'B';
  local_40.field_2._M_local_buf[5] = 'l';
  local_40.field_2._M_allocated_capacity._6_2_ = 0x636f;
  local_40.field_2._M_local_buf[8] = 'k';
  local_40.field_2._M_local_buf[9] = 's';
  local_40._M_string_length = 10;
  local_40.field_2._M_local_buf[10] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  AddExtraGenerator(this,&local_40,cmExtraCodeBlocksGenerator::New);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT26(local_40.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_40.field_2._M_local_buf[5],
                                      CONCAT14(local_40.field_2._M_local_buf[4],
                                               local_40.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x65646f43;
  local_40.field_2._M_local_buf[4] = 'L';
  local_40.field_2._M_local_buf[5] = 'i';
  local_40.field_2._M_allocated_capacity._6_2_ = 0x6574;
  local_40._M_string_length = 8;
  local_40.field_2._M_local_buf[8] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  AddExtraGenerator(this,&local_40,cmExtraCodeLiteGenerator::New);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT26(local_40.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_40.field_2._M_local_buf[5],
                                      CONCAT14(local_40.field_2._M_local_buf[4],
                                               local_40.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x6c627553;
  local_40.field_2._M_local_buf[4] = 'i';
  local_40.field_2._M_local_buf[5] = 'm';
  local_40.field_2._M_allocated_capacity._6_2_ = 0x2065;
  local_40.field_2._M_local_buf[8] = 'T';
  local_40.field_2._M_local_buf[9] = 'e';
  local_40.field_2._M_local_buf[10] = 'x';
  local_40.field_2._M_local_buf[0xb] = 't';
  local_40.field_2._M_local_buf[0xc] = ' ';
  local_40.field_2._M_local_buf[0xd] = '2';
  local_40._M_string_length = 0xe;
  local_40.field_2._M_local_buf[0xe] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  AddExtraGenerator(this,&local_40,cmExtraSublimeTextGenerator::New);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT26(local_40.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_40.field_2._M_local_buf[5],
                                      CONCAT14(local_40.field_2._M_local_buf[4],
                                               local_40.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x6574614b;
  local_40._M_string_length = 4;
  local_40.field_2._M_local_buf[4] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  AddExtraGenerator(this,&local_40,cmExtraKateGenerator::New);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT26(local_40.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_40.field_2._M_local_buf[5],
                                      CONCAT14(local_40.field_2._M_local_buf[4],
                                               local_40.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x696c6345;
  local_40.field_2._M_local_buf[4] = 'p';
  local_40.field_2._M_local_buf[5] = 's';
  local_40.field_2._M_allocated_capacity._6_2_ = 0x2065;
  local_40.field_2._M_local_buf[8] = 'C';
  local_40.field_2._M_local_buf[9] = 'D';
  local_40.field_2._M_local_buf[10] = 'T';
  local_40.field_2._M_local_buf[0xb] = '4';
  local_40._M_string_length = 0xc;
  local_40.field_2._M_local_buf[0xc] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  AddExtraGenerator(this,&local_40,cmExtraEclipseCDT4Generator::New);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT26(local_40.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_40.field_2._M_local_buf[5],
                                      CONCAT14(local_40.field_2._M_local_buf[4],
                                               local_40.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x7665444b;
  local_40.field_2._M_local_buf[4] = 'e';
  local_40.field_2._M_local_buf[5] = 'l';
  local_40.field_2._M_allocated_capacity._6_2_ = 0x706f;
  local_40.field_2._M_local_buf[8] = '3';
  local_40.field_2._M_local_buf[9] = '\0';
  local_40._M_string_length = 9;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  AddExtraGenerator(this,&local_40,cmGlobalKdevelopGenerator::New);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT26(local_40.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_40.field_2._M_local_buf[5],
                                      CONCAT14(local_40.field_2._M_local_buf[4],
                                               local_40.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  local_40.field_2._M_allocated_capacity._0_4_ = 0x7665444b;
  local_40.field_2._M_local_buf[4] = 'e';
  local_40.field_2._M_local_buf[5] = 'l';
  local_40.field_2._M_allocated_capacity._6_2_ = 0x706f;
  local_40.field_2._M_local_buf[8] = '3';
  local_40.field_2._M_local_buf[9] = '\0';
  local_40._M_string_length = 9;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  pp_Var2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
            ::operator[](&this->ExtraGenerators,&local_40);
  *pp_Var2 = cmGlobalKdevelopGenerator::New;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT26(local_40.field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_40.field_2._M_local_buf[5],
                                      CONCAT14(local_40.field_2._M_local_buf[4],
                                               local_40.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  return;
}

Assistant:

void cmake::AddDefaultExtraGenerators()
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
#if defined(_WIN32) && !defined(__CYGWIN__)
  // e.g. kdevelop4 ?
#endif

  this->AddExtraGenerator(cmExtraCodeBlocksGenerator::GetActualName(),
                          &cmExtraCodeBlocksGenerator::New);
  this->AddExtraGenerator(cmExtraCodeLiteGenerator::GetActualName(),
                          &cmExtraCodeLiteGenerator::New);
  this->AddExtraGenerator(cmExtraSublimeTextGenerator::GetActualName(),
                          &cmExtraSublimeTextGenerator::New);
  this->AddExtraGenerator(cmExtraKateGenerator::GetActualName(),
                          &cmExtraKateGenerator::New);

#ifdef CMAKE_USE_ECLIPSE
  this->AddExtraGenerator(cmExtraEclipseCDT4Generator::GetActualName(),
                          &cmExtraEclipseCDT4Generator::New);
#endif

#ifdef CMAKE_USE_KDEVELOP
  this->AddExtraGenerator(cmGlobalKdevelopGenerator::GetActualName(),
                          &cmGlobalKdevelopGenerator::New);
  // for kdevelop also add the generator with just the name of the
  // extra generator, since it was this way since cmake 2.2
  this->ExtraGenerators[cmGlobalKdevelopGenerator::GetActualName()]
                                             = &cmGlobalKdevelopGenerator::New;
#endif

#endif
}